

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

void __thiscall
cppcms::anon_unknown_0::base_handler<std::function<void_()>_>::~base_handler
          (base_handler<std::function<void_()>_> *this)

{
  ~base_handler(this);
  operator_delete(this);
  return;
}

Assistant:

base_handler(std::string expr,H handle,int a=0,int b=0,int c=0,int d=0,int e=0,int f=0)
				: option(expr),handle_(handle)
			{
				select_[0]=a;
				select_[1]=b;
				select_[2]=c;
				select_[3]=d;
				select_[4]=e;
				select_[5]=f;
			}